

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmNtk.c
# Opt level: O3

void Sfm_NtkDeleteObj_rec(Sfm_Ntk_t *p,int iNode)

{
  int iNode_00;
  Vec_Int_t *pVVar1;
  int *piVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  
  if ((iNode < 0) || ((p->vFanouts).nSize <= iNode)) {
LAB_004c33dc:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWec.h"
                  ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
  }
  if (((p->vFanouts).pArray[(uint)iNode].nSize < 1) && (p->nPis <= iNode)) {
    if (p->vFixed->nSize <= iNode) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecStr.h"
                    ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
    }
    if (p->vFixed->pArray[(uint)iNode] == '\0') {
      if (p->nObjs <= p->nPos + iNode) {
        __assert_fail("Sfm_ObjIsNode(p, iNode)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmNtk.c"
                      ,0x11d,"void Sfm_NtkDeleteObj_rec(Sfm_Ntk_t *, int)");
      }
      if (iNode < (p->vFanins).nSize) {
        lVar6 = 0;
        do {
          pVVar1 = (p->vFanins).pArray;
          if (pVVar1[(uint)iNode].nSize <= lVar6) {
            pVVar1[(uint)iNode].nSize = 0;
            if (iNode < p->vTruths->nSize) {
              p->vTruths->pArray[(uint)iNode] = 0;
              return;
            }
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWrd.h"
                          ,0x1ae,"void Vec_WrdWriteEntry(Vec_Wrd_t *, int, word)");
          }
          iNode_00 = pVVar1[(uint)iNode].pArray[lVar6];
          lVar4 = (long)iNode_00;
          if ((lVar4 < 0) || ((p->vFanouts).nSize <= iNode_00)) break;
          pVVar1 = (p->vFanouts).pArray;
          iVar3 = pVVar1[lVar4].nSize;
          if ((long)iVar3 < 1) {
            if (iVar3 != 0) {
              __assert_fail("i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                            ,0x3c1,"int Vec_IntRemove(Vec_Int_t *, int)");
            }
LAB_004c342f:
            __assert_fail("RetValue",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmNtk.c"
                          ,0x120,"void Sfm_NtkDeleteObj_rec(Sfm_Ntk_t *, int)");
          }
          piVar2 = pVVar1[lVar4].pArray;
          lVar5 = 1;
          while (piVar2[lVar5 + -1] != iNode) {
            bVar7 = lVar5 == iVar3;
            lVar5 = lVar5 + 1;
            if (bVar7) goto LAB_004c342f;
          }
          if ((int)lVar5 < iVar3) {
            do {
              piVar2[lVar5 + -1] = piVar2[lVar5];
              lVar5 = lVar5 + 1;
              iVar3 = pVVar1[lVar4].nSize;
            } while ((int)lVar5 < iVar3);
          }
          pVVar1[lVar4].nSize = iVar3 + -1;
          Sfm_NtkDeleteObj_rec(p,iNode_00);
          lVar6 = lVar6 + 1;
        } while (iNode < (p->vFanins).nSize);
      }
      goto LAB_004c33dc;
    }
  }
  return;
}

Assistant:

void Sfm_NtkDeleteObj_rec( Sfm_Ntk_t * p, int iNode )
{
    int i, iFanin;
    if ( Sfm_ObjFanoutNum(p, iNode) > 0 || Sfm_ObjIsPi(p, iNode) || Sfm_ObjIsFixed(p, iNode) )
        return;
    assert( Sfm_ObjIsNode(p, iNode) );
    Sfm_ObjForEachFanin( p, iNode, iFanin, i )
    {
        int RetValue = Vec_IntRemove( Sfm_ObjFoArray(p, iFanin), iNode );  assert( RetValue );
        Sfm_NtkDeleteObj_rec( p, iFanin );
    }
    Vec_IntClear( Sfm_ObjFiArray(p, iNode) );
    Vec_WrdWriteEntry( p->vTruths, iNode, (word)0 );
}